

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squall_call.hpp
# Opt level: O0

void squall::detail::call_setup<int,int,int,int>
               (HSQUIRRELVM vm,HSQOBJECT *table,string *name,int args,int args_1,int args_2,
               int args_3)

{
  HSQOBJECT obj;
  HSQOBJECT obj_00;
  SQRESULT SVar1;
  squirrel_error *psVar2;
  SQInteger in_stack_ffffffffffffff38;
  HSQUIRRELVM in_stack_ffffffffffffff40;
  HSQUIRRELVM pSVar3;
  HSQUIRRELVM in_stack_ffffffffffffff60;
  SQChar *in_stack_ffffffffffffff68;
  SQObjectValue in_stack_ffffffffffffff70;
  SQBool in_stack_ffffffffffffff78;
  SQInteger params;
  string local_60 [32];
  undefined8 local_40;
  SQObjectValue local_38;
  int local_2c;
  int local_28;
  int args_local_2;
  int args_local_1;
  int args_local;
  string *name_local;
  HSQOBJECT *table_local;
  HSQUIRRELVM vm_local;
  
  local_40 = *(undefined8 *)table;
  local_38 = table->_unVal;
  obj._unVal.pTable = in_stack_ffffffffffffff70.pTable;
  obj._0_8_ = in_stack_ffffffffffffff68;
  local_2c = args_2;
  local_28 = args_1;
  args_local_2 = args;
  _args_local_1 = name;
  name_local = (string *)table;
  table_local = (HSQOBJECT *)vm;
  sq_pushobject(in_stack_ffffffffffffff60,obj);
  pSVar3 = (HSQUIRRELVM)table_local;
  std::__cxx11::string::data();
  std::__cxx11::string::length();
  sq_pushstring((HSQUIRRELVM)in_stack_ffffffffffffff70.pTable,in_stack_ffffffffffffff68,
                (SQInteger)in_stack_ffffffffffffff60);
  SVar1 = sq_get(pSVar3,(SQInteger)in_stack_ffffffffffffff40);
  if (SVar1 < 0) {
    psVar2 = (squirrel_error *)__cxa_allocate_exception(0x10);
    std::operator+((char *)local_60,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "can\'t find such function: ");
    squirrel_error::squirrel_error(psVar2,local_60);
    __cxa_throw(psVar2,&squirrel_error::typeinfo,squirrel_error::~squirrel_error);
  }
  sq_remove(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  params = *(SQInteger *)name_local;
  pSVar3 = *(HSQUIRRELVM *)(name_local + 8);
  obj_00._unVal.pTable = in_stack_ffffffffffffff70.pTable;
  obj_00._0_8_ = in_stack_ffffffffffffff68;
  sq_pushobject(in_stack_ffffffffffffff60,obj_00);
  call_setup_arg<int,int,int,int>((HSQUIRRELVM)table_local,args_local_2,local_28,local_2c,args_3);
  SVar1 = sq_call(pSVar3,params,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70.nInteger);
  if (SVar1 < 0) {
    psVar2 = (squirrel_error *)__cxa_allocate_exception(0x10);
    std::operator+(&stack0xffffffffffffff60,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "function call failed: ");
    squirrel_error::squirrel_error(psVar2,(string *)&stack0xffffffffffffff60);
    __cxa_throw(psVar2,&squirrel_error::typeinfo,squirrel_error::~squirrel_error);
  }
  return;
}

Assistant:

inline
void call_setup(HSQUIRRELVM vm, const HSQOBJECT& table,
                const string& name, T... args) {

    sq_pushobject(vm, table);
    sq_pushstring(vm, name.data(), name.length());
    if (!SQ_SUCCEEDED(sq_get(vm, -2))) {
        throw squirrel_error(_SC("can't find such function: ") + name);
    }

    sq_remove(vm, -2);
    sq_pushobject(vm, table);
    call_setup_arg(vm, args...);
    if (!SQ_SUCCEEDED(sq_call(vm, sizeof...(args)+1, SQTrue, SQTrue))) {
        throw squirrel_error(_SC("function call failed: ") + name);
    }
}